

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O0

void __thiscall
GetOpt::GetOpt_pp::_parse
          (GetOpt_pp *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  fmtflags fVar1;
  Result RVar2;
  ulong uVar3;
  const_reference pvVar4;
  char *pcVar5;
  Token *pTVar6;
  mapped_type *pmVar7;
  key_type *pkVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  Type type;
  string local_268 [32];
  string local_248 [32];
  ulong local_228;
  size_t j;
  stringstream dummy;
  float local_98;
  int local_94;
  float aFloat;
  int anInt;
  string local_60 [32];
  const_reference local_40;
  string *currentArg;
  size_t i;
  size_t start;
  size_t argc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool any_option_processed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  GetOpt_pp *this_local;
  
  argc._7_1_ = 0;
  pvStack_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  start = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  i = 0;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_18,0);
    std::__cxx11::string::operator=((string *)&this->_app_name,(string *)pvVar4);
    i = 1;
  }
  for (currentArg = (string *)i; currentArg < start; currentArg = currentArg + 1) {
    local_40 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,(size_type)currentArg);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if ((*pcVar5 == '-') && (uVar3 = std::__cxx11::string::size(), 1 < uVar3)) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if (*pcVar5 == '-') {
        uVar3 = std::__cxx11::string::size();
        if (uVar3 < 3) {
          pTVar6 = _add_token(this,local_40,GlobalArgument);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
                   ::operator[](&this->_longOps,local_40);
          pmVar7->token = pTVar6;
        }
        else {
          std::__cxx11::string::substr((ulong)local_60,(ulong)local_40);
          pTVar6 = _add_token(this,local_60,LongOption);
          std::__cxx11::string::substr((ulong)&aFloat,(ulong)local_40);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
                   ::operator[](&this->_longOps,(key_type *)&aFloat);
          pmVar7->token = pTVar6;
          std::__cxx11::string::~string((string *)&aFloat);
          std::__cxx11::string::~string((string *)local_60);
        }
        argc._7_1_ = 1;
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&j);
        pvVar4 = local_40;
        fVar1 = std::ios_base::flags((ios_base *)((long)&j + *(long *)(j - 0x18)));
        RVar2 = convert<int>(pvVar4,&local_94,fVar1);
        pvVar4 = local_40;
        if (RVar2 == OK) {
          uVar3 = std::__cxx11::string::size();
          if (uVar3 < 3) {
            pTVar6 = _add_token(this,local_40,PossibleNegativeArgument);
            pkVar8 = (key_type *)std::__cxx11::string::operator[]((ulong)local_40);
            pmVar9 = std::
                     map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                     ::operator[](&this->_shortOps,pkVar8);
            pmVar9->token = pTVar6;
          }
          else {
            _add_token(this,local_40,(argc._7_1_ & 1) * 4 + GlobalArgument);
          }
        }
        else {
          fVar1 = std::ios_base::flags((ios_base *)((long)&j + *(long *)(j - 0x18)));
          RVar2 = convert<float>(pvVar4,&local_98,fVar1);
          if (RVar2 == OK) {
            _add_token(this,local_40,(argc._7_1_ & 1) * 4 + GlobalArgument);
          }
          else {
            for (local_228 = 1; uVar3 = local_228, uVar10 = std::__cxx11::string::size(),
                uVar3 < uVar10; local_228 = local_228 + 1) {
              std::__cxx11::string::string(local_248,(string *)local_40,local_228,1);
              pTVar6 = _add_token(this,(string *)local_248,ShortOption);
              pkVar8 = (key_type *)std::__cxx11::string::operator[]((ulong)local_40);
              pmVar9 = std::
                       map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                       ::operator[](&this->_shortOps,pkVar8);
              pmVar9->token = pTVar6;
              std::__cxx11::string::~string(local_248);
            }
          }
        }
        argc._7_1_ = 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&j);
      }
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if ((*pcVar5 == '@') && (uVar3 = std::__cxx11::string::size(), 1 < uVar3)) {
        std::__cxx11::string::substr((ulong)local_268,(ulong)local_40);
        _parse_sub_file(this,local_268);
        std::__cxx11::string::~string((string *)local_268);
      }
      else {
        type = GlobalArgument;
        if ((argc._7_1_ & 1) != 0) {
          type = UnknownYet;
        }
        _add_token(this,local_40,type);
      }
    }
  }
  this->_last = OK;
  return;
}

Assistant:

GETOPT_INLINE void GetOpt_pp::_parse(const std::vector<std::string>& args)
{
    bool any_option_processed = false;
    const size_t argc = args.size();

    size_t start = 0;
    if ( _app_name.empty() )
    {
        _app_name = args[0];
        start = 1;
    }

    // parse arguments by their '-' or '--':
    //   (this will be a state machine soon)
    for (size_t i = start; i < argc; i++)
    {
        const std::string& currentArg = args[i];

        if (currentArg[0] == '-' && currentArg.size() > 1)
        {
            // see what's next, differentiate whether it's short or long:
            if (currentArg[1] == '-')
            {
                if ( currentArg.size() > 2 )
                {
                    // long option
                    _longOps[currentArg.substr(2)].token = _add_token(currentArg.substr(2), Token::LongOption);
                }
                else
                {
                    // it's the -- option alone
                    _longOps[currentArg].token = _add_token(currentArg, Token::GlobalArgument);
                }

                any_option_processed = true;
            }
            else
            {
                // check if it is a negative number: rules
                //  * floating point negative numbers are straight classified as 'arguments'
                //  * integer negative numbers of more than 1 digit length are also 'arguments'
                //  * integer negatives of 1 digit length can be either arguments or short options.
                //  * anything else: short options.
                int anInt;
                float aFloat;
                std::stringstream dummy;
                if ( convert(currentArg, anInt, dummy.flags()) == _Option::OK )
                {
                    if ( currentArg.size() > 2 ) // if it's larger than -d (d=digit), then assume it's a negative number:
                        _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
                    else // size == 2: it's a 1 digit negative number
                        _shortOps[currentArg[1]].token = _add_token(currentArg, Token::PossibleNegativeArgument);
                }
                else if ( convert(currentArg, aFloat, dummy.flags()) == _Option::OK )
                    _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
                else
                {
                    // short option
                    // iterate over all of them, keeping the last one in currentData
                    // (so the intermediates will generate 'existent' arguments, as of '-abc')
                    for( size_t j = 1; j < currentArg.size(); j++ )
                        _shortOps[currentArg[j]].token = _add_token(std::string(currentArg, j, 1), Token::ShortOption);
                }

                any_option_processed = true;
            }
        }
        else if ( currentArg[0] == '@' && currentArg.size() > 1 )
        {
            // suboptions file
            _parse_sub_file(currentArg.substr(1));
        }
        else
        {
            _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
        }
    }

    _last = _Option::OK;    // TODO: IMPROVE!!
}